

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_info.cpp
# Opt level: O2

void __thiscall
duckdb::ArrowListInfo::ArrowListInfo
          (ArrowListInfo *this,shared_ptr<duckdb::ArrowType,_true> *child,ArrowVariableSizeType size
          )

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  (this->super_ArrowTypeInfo).type = LIST;
  (this->super_ArrowTypeInfo)._vptr_ArrowTypeInfo = (_func_int **)&PTR__ArrowListInfo_027caa20;
  (this->super_ArrowTypeInfo).field_0x9 = size;
  (this->super_ArrowTypeInfo).field_0xa = 0;
  (this->child).internal.super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (child->internal).super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (child->internal).super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (child->internal).super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->child).internal.super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (this->child).internal.super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  (child->internal).super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  return;
}

Assistant:

ArrowListInfo::ArrowListInfo(shared_ptr<ArrowType> child, ArrowVariableSizeType size)
    : ArrowTypeInfo(ArrowTypeInfoType::LIST), size_type(size), child(std::move(child)) {
}